

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::BackSubstituteAboveDiagonal(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  PeelColumn *pPVar5;
  uint64_t *puVar6;
  uint16_t *puVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ushort uVar11;
  uint8_t *puVar13;
  ushort *puVar14;
  uint uVar15;
  ulong uVar16;
  uint8_t *puVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint8_t *vy;
  ulong uVar27;
  bool bVar28;
  uint8_t *win_table [128];
  ulong local_4c0;
  uint local_4a8;
  ulong local_470;
  uint8_t *local_430 [2];
  void *local_420;
  uint8_t *local_418;
  void *local_410;
  void *local_408;
  void *local_400;
  uint8_t *local_3f8 [8];
  uint8_t *local_3b8 [16];
  uint8_t *local_338 [32];
  uint8_t *local_238 [64];
  undefined8 uStack_38;
  uint uVar12;
  ulong uVar23;
  
  uVar20 = (this->_defer_count - 1) + (uint)this->_mix_count;
  uVar23 = (ulong)uVar20;
  uVar11 = this->_dense_count + this->_defer_count;
  uVar12 = (uint)uVar11;
  uVar3 = this->_first_heavy_column;
  uVar19 = (ulong)uVar3;
  if (0x2c < uVar20) {
    local_4a8 = 0x2d;
    if (uVar20 >= 0x46) {
      local_4a8 = 0x46;
    }
    if (0x86 < uVar20) {
      local_4a8 = 0x87;
    }
    uVar9 = 7;
    if (0x86 >= uVar20) {
      uVar9 = 6 - (uVar20 < 0x46);
    }
    uVar8 = 1;
    uVar20 = 1 << (uVar9 & 0x1f);
    uVar1 = this->_block_count;
    if (uVar1 != 0) {
      puVar13 = this->_recovery_blocks;
      pPVar5 = this->_peel_cols;
      uVar21 = this->_block_bytes;
      lVar18 = 0;
      do {
        if ((&pPVar5->Mark)[lVar18] == '\x01') {
          local_430[(ulong)uVar8 - 1] = puVar13;
          uVar8 = uVar8 + 1;
          if (uVar20 <= uVar8) break;
        }
        puVar13 = puVar13 + uVar21;
        lVar18 = lVar18 + 6;
      } while ((uint)uVar1 * 6 != (int)lVar18);
    }
    uVar16 = uVar23;
    if (uVar20 <= uVar8) {
      do {
        uVar8 = (uint)uVar16;
        uVar21 = uVar8 - uVar9;
        uVar23 = (ulong)uVar21;
        uVar24 = uVar21 + 1;
        uVar10 = (ulong)uVar24;
        if (uVar24 < uVar8) {
          local_4c0 = 1L << (uVar16 & 0x3f);
          uVar27 = uVar16;
          do {
            puVar13 = this->_recovery_blocks + (uint)this->_ge_col_map[uVar27] * this->_block_bytes;
            if ((uVar19 <= uVar27 && uVar11 <= this->_pivots[uVar27]) &&
               ((ulong)this->_heavy_matrix
                       [((uint)this->_pivots[uVar27] - (uint)uVar11 & 0xffff) * this->_heavy_pitch +
                        ((int)uVar27 - uVar3)] != 1)) {
              gf256_mul_mem(puVar13,puVar13,
                            GF256Ctx.GF256_INV_TABLE
                            [this->_heavy_matrix
                             [((uint)this->_pivots[uVar27] - (uint)uVar11 & 0xffff) *
                              this->_heavy_pitch + ((int)uVar27 - uVar3)]],this->_block_bytes);
            }
            puVar6 = this->_ge_matrix;
            uVar25 = uVar10;
            do {
              uVar26 = uVar25 + 1;
              uVar1 = this->_pivots[uVar25];
              if ((uVar1 < uVar11) || (uVar27 < uVar19)) {
                if ((*(ulong *)((long)puVar6 +
                               (ulong)((uint)uVar1 * this->_ge_pitch) * 8 +
                               (ulong)(((uint)(uVar27 >> 6) & 0x3ffffff) << 3)) & local_4c0) != 0) {
                  gf256_add_mem(this->_recovery_blocks +
                                (uint)this->_ge_col_map[uVar25] * this->_block_bytes,puVar13,
                                this->_block_bytes);
                }
              }
              else if (this->_heavy_matrix
                       [(uVar1 - uVar12) * this->_heavy_pitch + ((int)uVar27 - uVar3)] != '\0') {
                gf256_muladd_mem(this->_recovery_blocks +
                                 (uint)this->_ge_col_map[uVar25] * this->_block_bytes,
                                 this->_heavy_matrix
                                 [(uVar1 - uVar12) * this->_heavy_pitch + ((int)uVar27 - uVar3)],
                                 puVar13,this->_block_bytes);
              }
              uVar25 = uVar26;
            } while ((uVar26 & 0xffffffff) != uVar27);
            local_4c0 = local_4c0 >> 1 | local_4c0 << 0x3f;
            uVar27 = uVar27 - 1;
          } while (uVar24 < (uint)uVar27);
        }
        if ((uVar3 <= uVar24 && uVar11 <= this->_pivots[uVar10]) &&
           ((ulong)this->_heavy_matrix
                   [(this->_pivots[uVar10] - uVar12) * this->_heavy_pitch + (uVar24 - uVar3)] != 1))
        {
          gf256_mul_mem(this->_recovery_blocks +
                        (uint)this->_ge_col_map[uVar10] * this->_block_bytes,
                        this->_recovery_blocks +
                        (uint)this->_ge_col_map[uVar10] * this->_block_bytes,
                        GF256Ctx.GF256_INV_TABLE
                        [this->_heavy_matrix
                         [(this->_pivots[uVar10] - uVar12) * this->_heavy_pitch + (uVar24 - uVar3)]]
                        ,this->_block_bytes);
        }
        uVar15 = this->_block_bytes;
        puVar17 = this->_recovery_blocks + this->_ge_col_map[uVar10] * uVar15;
        vy = this->_recovery_blocks + this->_ge_col_map[uVar21 + 2] * uVar15;
        local_430[0] = puVar17;
        local_430[1] = vy;
        gf256_addset_mem(local_420,puVar17,vy,uVar15);
        puVar13 = this->_recovery_blocks + (uint)this->_ge_col_map[uVar21 + 3] * this->_block_bytes;
        local_418 = puVar13;
        gf256_addset_mem(local_410,puVar17,puVar13,this->_block_bytes);
        gf256_addset_mem(local_408,vy,puVar13,this->_block_bytes);
        gf256_addset_mem(local_400,puVar17,local_408,this->_block_bytes);
        uVar1 = this->_ge_col_map[uVar21 + 4];
        uVar15 = this->_block_bytes;
        puVar13 = this->_recovery_blocks;
        local_3f8[0] = puVar13 + uVar1 * uVar15;
        lVar18 = -7;
        do {
          gf256_addset_mem(local_3b8[lVar18],local_3f8[lVar18],puVar13 + uVar1 * uVar15,
                           this->_block_bytes);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0);
        if (4 < uVar9) {
          uVar1 = this->_ge_col_map[uVar21 + 5];
          uVar15 = this->_block_bytes;
          puVar13 = this->_recovery_blocks;
          local_3b8[0] = puVar13 + uVar1 * uVar15;
          lVar18 = -0xf;
          do {
            gf256_addset_mem(local_338[lVar18],local_3b8[lVar18],puVar13 + uVar1 * uVar15,
                             this->_block_bytes);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 0);
          if (uVar9 != 5) {
            uVar1 = this->_ge_col_map[uVar21 + 6];
            uVar15 = this->_block_bytes;
            puVar13 = this->_recovery_blocks;
            local_338[0] = puVar13 + uVar1 * uVar15;
            lVar18 = -0x1f;
            do {
              gf256_addset_mem(local_238[lVar18],local_338[lVar18],puVar13 + uVar1 * uVar15,
                               this->_block_bytes);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0);
            if (6 < uVar9) {
              uVar1 = this->_ge_col_map[uVar21 + 7];
              uVar15 = this->_block_bytes;
              puVar13 = this->_recovery_blocks;
              local_238[0] = puVar13 + uVar1 * uVar15;
              lVar18 = -0x3f;
              do {
                gf256_addset_mem((void *)(&uStack_38)[lVar18],local_238[lVar18],
                                 puVar13 + uVar1 * uVar15,this->_block_bytes);
                lVar18 = lVar18 + 1;
              } while (lVar18 != 0);
            }
          }
        }
        uVar15 = 0x7fff;
        if ((uVar3 <= uVar8) && (uVar15 = uVar12, uVar24 != 0)) {
          puVar14 = this->_pivots;
          local_470 = 0;
          do {
            uVar1 = *puVar14;
            if (uVar11 <= uVar1) {
              uVar2 = this->_ge_col_map[local_470];
              uVar4 = this->_block_bytes;
              puVar13 = this->_recovery_blocks;
              uVar27 = uVar10;
              if ((uVar24 < uVar3) && (uVar24 <= uVar8)) {
                uVar22 = this->_ge_pitch;
                puVar6 = this->_ge_matrix;
                uVar25 = 1L << (uVar10 & 0x3f);
                uVar26 = uVar10;
                do {
                  if ((puVar6[(ulong)(uVar22 * uVar1) + (uVar26 >> 6 & 0x3ffffff)] & uVar25) != 0) {
                    gf256_add_mem(puVar13 + uVar2 * uVar4,
                                  this->_recovery_blocks +
                                  (uint)this->_ge_col_map[uVar26] * this->_block_bytes,
                                  this->_block_bytes);
                  }
                  uVar27 = uVar26 + 1;
                } while ((uVar27 < uVar19) &&
                        (uVar25 = uVar25 >> 0x3f | uVar25 << 1, bVar28 = uVar26 < uVar16,
                        uVar26 = uVar27, bVar28));
              }
              if ((uint)uVar27 <= uVar8) {
                puVar17 = this->_heavy_matrix +
                          ((uVar1 - uVar12) * this->_heavy_pitch + ((uint)uVar27 - uVar3));
                do {
                  if (*puVar17 != '\0') {
                    gf256_muladd_mem(puVar13 + uVar2 * uVar4,*puVar17,
                                     this->_recovery_blocks +
                                     (uint)this->_ge_col_map[uVar27 & 0xffffffff] *
                                     this->_block_bytes,this->_block_bytes);
                  }
                  puVar17 = puVar17 + 1;
                  uVar22 = (int)uVar27 + 1;
                  uVar27 = (ulong)uVar22;
                } while (uVar22 <= uVar8);
              }
            }
            puVar14 = puVar14 + 1;
            local_470 = local_470 + 1;
          } while (local_470 != uVar10);
        }
        uVar4 = uVar24 >> 6;
        uVar22 = uVar24 & 0x3f;
        puVar7 = this->_pivots;
        if (uVar4 == uVar8 >> 6) {
          if (uVar24 != 0) {
            uVar16 = 0;
            do {
              uVar1 = puVar7[uVar16];
              if ((uVar1 < uVar15) &&
                 (uVar8 = (uint)(this->_ge_matrix
                                 [(ulong)uVar4 + (ulong)((uint)uVar1 * this->_ge_pitch)] >>
                                (ulong)uVar22) & uVar20 - 1, uVar8 != 0)) {
                gf256_add_mem(this->_recovery_blocks +
                              (uint)this->_ge_col_map[uVar16 & 0xffff] * this->_block_bytes,
                              local_430[(ulong)uVar8 - 1],this->_block_bytes);
              }
              uVar16 = uVar16 + 1;
            } while (((uint)uVar16 & 0xffff) < uVar24);
          }
        }
        else if (uVar24 != 0) {
          uVar16 = 0;
          do {
            uVar1 = puVar7[uVar16];
            if ((uVar1 < uVar15) &&
               (uVar10 = (ulong)((uint)uVar1 * this->_ge_pitch),
               uVar8 = ((uint)(this->_ge_matrix[(ulong)uVar4 + uVar10 + 1] <<
                              ((ulong)(0x40 - uVar22) & 0x3f)) |
                       (uint)(this->_ge_matrix[uVar4 + uVar10] >> (ulong)uVar22)) & uVar20 - 1,
               uVar8 != 0)) {
              gf256_add_mem(this->_recovery_blocks +
                            (uint)this->_ge_col_map[uVar16 & 0xffff] * this->_block_bytes,
                            local_430[(ulong)uVar8 - 1],this->_block_bytes);
            }
            uVar16 = uVar16 + 1;
          } while (((uint)uVar16 & 0xffff) < uVar24);
        }
        bVar28 = true;
        if (uVar21 < local_4a8) {
          if (uVar21 < 0x46) {
            if (uVar21 < 0x2d) {
              if (uVar21 < 0x18) {
                bVar28 = false;
                goto LAB_0010665f;
              }
              uVar9 = 4;
              local_4a8 = 0x18;
            }
            else {
              uVar9 = 5;
              local_4a8 = 0x2d;
            }
          }
          else {
            uVar9 = 6;
            local_4a8 = 0x46;
          }
          uVar20 = 1 << uVar9;
        }
LAB_0010665f:
        uVar16 = uVar23;
      } while (bVar28);
    }
  }
  local_4c0 = 1L << (uVar23 & 0x3f);
  do {
    uVar20 = (uint)uVar23;
    puVar13 = this->_recovery_blocks + (uint)this->_ge_col_map[uVar23] * this->_block_bytes;
    if ((uVar3 <= uVar20 && uVar11 <= this->_pivots[uVar23]) &&
       ((ulong)this->_heavy_matrix
               [(this->_pivots[uVar23] - uVar12) * this->_heavy_pitch + (uVar20 - uVar3)] != 1)) {
      gf256_mul_mem(puVar13,puVar13,
                    GF256Ctx.GF256_INV_TABLE
                    [this->_heavy_matrix
                     [(this->_pivots[uVar23] - uVar12) * this->_heavy_pitch + (uVar20 - uVar3)]],
                    this->_block_bytes);
    }
    if (uVar20 != 0) {
      puVar6 = this->_ge_matrix;
      uVar16 = 0;
      do {
        uVar1 = this->_pivots[uVar16];
        if ((uVar1 < uVar11) || (uVar16 < uVar19)) {
          if ((*(ulong *)((long)puVar6 +
                         (ulong)((uint)uVar1 * this->_ge_pitch) * 8 +
                         (ulong)(uint)((int)(uVar23 >> 6) << 3)) & local_4c0) != 0) {
            gf256_add_mem(this->_recovery_blocks +
                          (uint)this->_ge_col_map[uVar16] * this->_block_bytes,puVar13,
                          this->_block_bytes);
          }
        }
        else if (this->_heavy_matrix[(uVar1 - uVar12) * this->_heavy_pitch + (uVar20 - uVar3)] !=
                 '\0') {
          gf256_muladd_mem(this->_recovery_blocks +
                           (uint)this->_ge_col_map[uVar16] * this->_block_bytes,
                           this->_heavy_matrix
                           [(uVar1 - uVar12) * this->_heavy_pitch + (uVar20 - uVar3)],puVar13,
                           this->_block_bytes);
        }
        uVar16 = uVar16 + 1;
      } while (uVar23 != uVar16);
    }
    uVar9 = uVar20 - 1;
    if (uVar20 == 0) {
      uVar9 = 0;
    }
    if (uVar20 != 0) {
      local_4c0 = local_4c0 >> 1 | local_4c0 << 0x3f;
    }
    uVar23 = (ulong)uVar9;
  } while (uVar20 != 0);
  return;
}

Assistant:

void Codec::BackSubstituteAboveDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- BackSubstituteAboveDiagonal ----" << endl << endl;)

    CAT_IF_ROWOP(unsigned rowops = 0; unsigned heavyops = 0;)

    const unsigned pivot_count = _defer_count + _mix_count;
    unsigned pivot_i = pivot_count - 1;
    const uint16_t first_heavy_row = _defer_count + _dense_count;
    const unsigned first_heavy_column = _first_heavy_column;

#if defined(CAT_WINDOWED_BACKSUB)
    // Build temporary storage space if windowing is to be used
    if (pivot_i >= CAT_ABOVE_WIN_THRESH_5)
    {
        // Calculate initial window size
        unsigned w, next_check_i;
        if (pivot_i >= CAT_ABOVE_WIN_THRESH_7) {
            w = 7;
            next_check_i = CAT_ABOVE_WIN_THRESH_7;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
            w = 6;
            next_check_i = CAT_ABOVE_WIN_THRESH_6;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
            w = 5;
            next_check_i = CAT_ABOVE_WIN_THRESH_5;
        }
        else {
            w = 4;
            next_check_i = CAT_ABOVE_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed back-substitution with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // NOTE: The peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space.
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        // For each original data column:
        for (unsigned count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal back-substitute." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned backsub_i = pivot_i - w + 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << backsub_i << " to " << pivot_i << " (inclusive)" << endl;)

            // Eliminate upper triangular part above windowed bits:

            // For each column:
            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);
            for (unsigned src_pivot_i = pivot_i; src_pivot_i > backsub_i; --src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                const uint16_t ge_row_i = _pivots[src_pivot_i];

                // If diagonal element is heavy:
                if (ge_row_i >= first_heavy_row &&
                    src_pivot_i >= first_heavy_column)
                {
                    // Look up row value
                    CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                    uint16_t heavy_row_i = ge_row_i - first_heavy_row;
                    CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                    unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
                    const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                    // Normalize code value, setting it to 1 (implicitly nonzero)
                    if (code_value != 1) {
                        gf256_div_mem(src, src, code_value, _block_bytes);
                        CAT_IF_ROWOP(++heavyops;)
                    }

                    CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
                }

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = backsub_i; dest_pivot_i < src_pivot_i; ++dest_pivot_i)
                {
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If row is heavy:
                    if (dest_row_i >= first_heavy_row && src_pivot_i >= first_heavy_column)
                    {
                        CAT_DEBUG_ASSERT(dest_row_i >= first_heavy_row);
                        const unsigned heavy_row_i = dest_row_i - first_heavy_row;
                        CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                        const unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                        const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                        // If column is zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                        CAT_IF_DUMP(cout << " h" << dest_pivot_i;)
                    }
                    else
                    {
                        // If bit is set in that row:
                        if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                        {
                            CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                            uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                            // Back-substitute
                            gf256_add_mem(dest, src, _block_bytes);

                            CAT_IF_ROWOP(++rowops;)
                            CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                        }
                    }
                } // next pivot above

                ge_mask = CAT_ROR64(ge_mask, 1);

                CAT_IF_DUMP(cout << endl;)
            } // next pivot

            // Normalize the final diagonal element
            const uint16_t ge_row_i = _pivots[backsub_i];

            // If this is a heavy row and column:
            if (ge_row_i >= first_heavy_row &&
                backsub_i >= first_heavy_column)
            {
                CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                CAT_DEBUG_ASSERT(backsub_i >= first_heavy_column);
                const unsigned heavy_row_i = ge_row_i - first_heavy_row;
                const unsigned heavy_col_i = backsub_i - first_heavy_column;
                CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                // Look up row value
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // Divide by this code value (implicitly nonzero)
                if (code_value != 1)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];

                    gf256_div_mem(src, src, code_value, _block_bytes);
                    CAT_IF_ROWOP(++heavyops;)
                }
            }

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            // If a row above the window may be heavy:
            if (pivot_i >= first_heavy_column)
            {
                const uint16_t * GF256_RESTRICT pivot_row = _pivots;

                // For each pivot in the window:
                for (unsigned ge_above_i = 0; ge_above_i < backsub_i; ++ge_above_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If row is not heavy:
                    if (ge_row_k < first_heavy_row) {
                        continue; // Skip it
                    }

                    CAT_DEBUG_ASSERT(_ge_col_map[ge_above_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_above_i];
                    unsigned ge_column_j = backsub_i;

                    // If the first column of window is not heavy:
                    if (ge_column_j < first_heavy_column)
                    {
                        uint64_t ge_mask2 = (uint64_t)1 << (ge_column_j & 63);
                        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_k;

                        // For each non-heavy column in the extra row:
                        for (; ge_column_j < first_heavy_column && ge_column_j <= pivot_i; ++ge_column_j)
                        {
                            const uint64_t ge_word = ge_row[ge_column_j >> 6];
                            const bool nonzero = 0 != (ge_word & ge_mask2);

                            // If column is non-zero:
                            if (nonzero)
                            {
                                CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                                const uint8_t *src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                                gf256_add_mem(dest, src, _block_bytes);

                                CAT_IF_ROWOP(++rowops;)
                            }

                            ge_mask2 = CAT_ROL64(ge_mask2, 1);
                        }
                    }

                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    CAT_DEBUG_ASSERT(ge_column_j >= first_heavy_column);
                    const unsigned heavy_row_i = ge_row_k - first_heavy_row;
                    const unsigned heavy_col_j = ge_column_j - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                    const uint8_t * GF256_RESTRICT heavy_row = &_heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_j];

                    // For each heavy column:
                    for (; ge_column_j <= pivot_i; ++ge_column_j)
                    {
                        const uint8_t code_value = *heavy_row++;

                        // If zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                    } // next column in row
                } // next pivot in window
            } // end if contains heavy

            // Only add window table entries for rows under this limit
            const uint16_t window_row_limit = (pivot_i >= first_heavy_column) ? first_heavy_row : 0x7fff;

            const uint32_t first_word = backsub_i >> 6;
            const uint32_t shift0 = backsub_i & 63;
            const uint32_t last_word = pivot_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const uint32_t win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row,
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const unsigned win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i -= w;
            if (pivot_i < next_check_i)
            {
                if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = CAT_ABOVE_WIN_THRESH_6;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = CAT_ABOVE_WIN_THRESH_5;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = CAT_ABOVE_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_BACKSUB

    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For each remaining pivot:
    for (;;)
    {
        // Calculate source
        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
        uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];

        const uint16_t ge_row_i = _pivots[pivot_i];

        // If diagonal element is heavy:
        if (ge_row_i >= first_heavy_row &&
            pivot_i >= first_heavy_column)
        {
            // Look up row value
            CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
            const unsigned heavy_row_i = ge_row_i - first_heavy_row;
            CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
            const unsigned heavy_col_i = pivot_i - first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
            CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
            const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

            // Normalize code value, setting it to 1 (implicitly nonzero)
            if (code_value != 1) {
                gf256_div_mem(src, src, code_value, _block_bytes);
                CAT_IF_ROWOP(++heavyops;)
            }

            CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
        }

        CAT_IF_DUMP(cout << "Pivot " << pivot_i << "[" << (unsigned)src[0] << "]:";)

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (pivot_i >> 6);

        // For each pivot row above it:
        for (unsigned ge_up_i = 0; ge_up_i < pivot_i; ++ge_up_i)
        {
            const uint16_t up_row_i = _pivots[ge_up_i];

            // If element is heavy:
            if (up_row_i >= first_heavy_row &&
                ge_up_i >= first_heavy_column)
            {
                const unsigned heavy_row_i = up_row_i - first_heavy_row;
                const unsigned heavy_col_i = pivot_i - first_heavy_column;
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // If column is zero:
                if (!code_value) {
                    continue; // Skip it
                }

                CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                // Back-substitute
                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) {
                    ++rowops;
                }
                else {
                    ++heavyops;
                })
                CAT_IF_DUMP(cout << " h" << up_row_i;)
            }
            else
            {
                // If bit is set in that row,
                if (ge_row[_ge_pitch * up_row_i] & ge_mask)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                    // Back-substitute
                    gf256_add_mem(dest, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << " " << up_row_i;)
                }
            }
        } // next pivot above

        if (pivot_i <= 0) {
            break;
        }
        --pivot_i;

        ge_mask = CAT_ROR64(ge_mask, 1);

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "BackSubstituteAboveDiagonal used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}